

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_celsius.cc
# Opt level: O3

void __thiscall hwtest::pgraph::MthdCelsiusUnk3f0::emulate_mthd(MthdCelsiusUnk3f0 *this)

{
  pgraph_state *state;
  uint val;
  
  state = &(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp;
  pgraph_celsius_pre_icmd(state);
  if (((this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.celsius_config_c & 0x100) !=
      0) {
    MthdTest::warn((MthdTest *)this,4);
    return;
  }
  if (((this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.nsource & 2) == 0) {
    val = ((this->super_SingleMthdTest).super_MthdTest.val & 3) << 0x1a |
          (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_raster & 0xf3ffffff
    ;
    (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_raster = val;
    pgraph_celsius_icmd(state,0x22,val,true);
    return;
  }
  return;
}

Assistant:

void emulate_mthd() override {
		pgraph_celsius_pre_icmd(&exp);
		uint32_t err = 0;
		if (extr(exp.celsius_config_c, 8, 1))
			err |= 4;
		if (err) {
			warn(err);
		} else {
			if (!extr(exp.nsource, 1, 1)) {
				insrt(exp.bundle_raster, 26, 2, val);
				pgraph_celsius_icmd(&exp, 0x22, exp.bundle_raster, true);
			}
		}
	}